

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

TypedImageChannel<float> * __thiscall
TypedImageChannel<float>::slice(TypedImageChannel<float> *this)

{
  int *piVar1;
  long in_RSI;
  
  piVar1 = *(int **)(in_RSI + 8);
  Imf_3_4::Slice::Make
            ((PixelType)this,(void *)0x2,*(Box **)(in_RSI + 0x28),(ulong)piVar1,4,
             ((piVar1[2] - *piVar1) + 1) / *(int *)(in_RSI + 0x10) << 2,*(int *)(in_RSI + 0x10),0.0,
             SUB41(*(undefined4 *)(in_RSI + 0x14),0),false);
  return this;
}

Assistant:

IMF::Slice
TypedImageChannel<T>::slice () const
{
    const IMATH_NAMESPACE::Box2i& dw = image ().dataWindow ();
    int                           w  = dw.max.x - dw.min.x + 1;

    return IMF::Slice::Make (
        pixelType (),
        &_pixels[0][0],
        dw,
        sizeof (T),
        (w / _xSampling) * sizeof (T),
        _xSampling,
        _ySampling);
}